

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::bt_peer_connection::on_unchoke(bt_peer_connection *this,int received)

{
  bool bVar1;
  int iVar2;
  error_code local_20;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar2 = crypto_receive_buffer::packet_size(&this->m_recv_buffer);
  if (iVar2 == 1) {
    bVar1 = crypto_receive_buffer::packet_finished(&this->m_recv_buffer);
    if (bVar1) {
      peer_connection::incoming_unchoke(&this->super_peer_connection);
      return;
    }
  }
  else {
    local_20 = errors::make_error_code(invalid_unchoke);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&local_20,1,2);
  }
  return;
}

Assistant:

void bt_peer_connection::on_unchoke(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);
		if (m_recv_buffer.packet_size() != 1)
		{
			disconnect(errors::invalid_unchoke, operation_t::bittorrent, peer_error);
			return;
		}
		if (!m_recv_buffer.packet_finished()) return;

		incoming_unchoke();
	}